

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

QSize __thiscall QLineEdit::sizeHint(QLineEdit *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  QLineEditPrivate *this_00;
  int iVar5;
  int iVar6;
  QStyle *pQVar7;
  QSize QVar8;
  int iVar9;
  long in_FS_OFFSET;
  QMargins QVar10;
  QFontMetrics fm;
  QStyleOptionFrame opt;
  int local_98;
  int local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  QWidget::ensurePolished(&this->super_QWidget);
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_90,&((this->super_QWidget).data)->fnt);
  pQVar7 = QWidget::style(&this->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x3e,0,this);
  QVar10 = QLineEditPrivate::effectiveTextMargins(this_00);
  iVar6 = QFontMetrics::height();
  iVar9 = iVar5 + -2;
  if (iVar5 < 0x11) {
    iVar9 = 0xe;
  }
  if (iVar9 < iVar6) {
    iVar9 = iVar6;
  }
  sVar1 = (this_00->super_QWidgetPrivate).topmargin;
  sVar2 = (this_00->super_QWidgetPrivate).bottommargin;
  iVar5 = QFontMetrics::horizontalAdvance((QChar)(char16_t)(QFontMetrics *)&local_90);
  sVar3 = (this_00->super_QWidgetPrivate).leftmargin;
  sVar4 = (this_00->super_QWidgetPrivate).rightmargin;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&local_88);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionFrame *)&local_88);
  pQVar7 = QWidget::style(&this->super_QWidget);
  local_98 = QVar10.m_right.m_i.m_i + QVar10.m_left.m_i.m_i + iVar5 * 0x11 + 4 +
             (int)sVar4 + (int)sVar3;
  local_94 = (int)sVar2 + (int)sVar1 + QVar10.m_bottom.m_i.m_i + QVar10.m_top.m_i.m_i + iVar9 + 2;
  QVar8 = (QSize)(**(code **)(*(long *)pQVar7 + 0xe8))
                           (pQVar7,0xe,(QStyleOptionFrame *)&local_88,&local_98,this);
  QStyleOption::~QStyleOption((QStyleOption *)&local_88);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QSize QLineEdit::sizeHint() const
{
    Q_D(const QLineEdit);
    ensurePolished();
    QFontMetrics fm(font());
    const int iconSize = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, this);
    const QMargins tm = d->effectiveTextMargins();
    int h = qMax(fm.height(), qMax(14, iconSize - 2)) + 2 * QLineEditPrivate::verticalMargin
            + tm.top() + tm.bottom()
            + d->topmargin + d->bottommargin;
    int w = fm.horizontalAdvance(u'x') * 17 + 2 * QLineEditPrivate::horizontalMargin
            + tm.left() + tm.right()
            + d->leftmargin + d->rightmargin; // "some"
    QStyleOptionFrame opt;
    initStyleOption(&opt);
    return style()->sizeFromContents(QStyle::CT_LineEdit, &opt, QSize(w, h), this);
}